

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

bool __thiscall S1Interval::Contains(S1Interval *this,double p)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  double local_18;
  double p_local;
  S1Interval *this_local;
  
  local_18 = p;
  p_local = (double)this;
  if (ABS(p) <= 3.141592653589793) {
    if ((p == -3.141592653589793) && (!NAN(p))) {
      local_18 = 3.141592653589793;
    }
    bVar1 = FastContains(this,local_18);
    return bVar1;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
             ,0x48,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_30);
  poVar2 = std::operator<<(poVar2,"Check failed: (fabs(p)) <= (3.14159265358979323846) ");
  S2LogMessageVoidify::operator&(&local_19,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

bool S1Interval::Contains(double p) const {
  // Works for empty, full, and singleton intervals.
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;
  return FastContains(p);
}